

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void bitset_container_printf(bitset_container_t *v)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  char *__format;
  ulong uVar5;
  
  putchar(0x7b);
  bVar4 = true;
  lVar2 = 0;
  uVar3 = 0;
  do {
    for (uVar5 = v->words[lVar2]; uVar5 != 0; uVar5 = uVar5 & uVar5 - 1) {
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      __format = ",%u";
      if (bVar4) {
        __format = "%u";
        bVar4 = false;
      }
      printf(__format,(ulong)((uint)lVar1 | uVar3));
    }
    uVar3 = uVar3 + 0x40;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x400);
  putchar(0x7d);
  return;
}

Assistant:

void bitset_container_printf(const bitset_container_t * v) {
	printf("{");
	uint32_t base = 0;
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = __builtin_ctzll(w);
			if(iamfirst) {// predicted to be false
				printf("%u",base + r);
				iamfirst = false;
			} else {
				printf(",%u",base + r);
			}
			w ^= t;
		}
		base += 64;
	}
	printf("}");
}